

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O0

void spell_dehydrate(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  long in_RCX;
  CHAR_DATA *victim;
  undefined1 in_stack_00001312;
  undefined1 in_stack_00001313;
  int in_stack_00001314;
  int in_stack_00001318;
  int in_stack_0000131c;
  CHAR_DATA *in_stack_00001320;
  CHAR_DATA *in_stack_00001328;
  int in_stack_00001348;
  int in_stack_00001350;
  char *in_stack_00001358;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  int in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  char *in_stack_ffffffffffffffb0;
  
  bVar1 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  if ((bVar1) || (*(short *)(*(long *)(in_RCX + 0xc0) + 0x3e0) < 0x33)) {
    act(in_stack_ffffffffffffffb0,
        (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
        (void *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
        (void *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),0);
    act(in_stack_ffffffffffffffb0,
        (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
        (void *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
        (void *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),0);
    act(in_stack_ffffffffffffffb0,
        (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
        (void *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
        (void *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),0);
    bVar1 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    if (bVar1) {
      dice(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
      damage_new(in_stack_00001328,in_stack_00001320,in_stack_0000131c,in_stack_00001318,
                 in_stack_00001314,(bool)in_stack_00001313,(bool)in_stack_00001312,in_stack_00001348
                 ,in_stack_00001350,in_stack_00001358);
    }
    else {
      dice(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
      damage_new(in_stack_00001328,in_stack_00001320,in_stack_0000131c,in_stack_00001318,
                 in_stack_00001314,(bool)in_stack_00001313,(bool)in_stack_00001312,in_stack_00001348
                 ,in_stack_00001350,in_stack_00001358);
      if (-1 < *(short *)(*(long *)(in_RCX + 0xc0) + 0x3e0)) {
        *(undefined2 *)(*(long *)(in_RCX + 0xc0) + 0x3e0) = 0x32;
      }
    }
  }
  else {
    act(in_stack_ffffffffffffffb0,
        (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
        (void *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
        (void *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),0);
  }
  return;
}

Assistant:

void spell_dehydrate(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;

	if (!is_npc(victim) && victim->pcdata->condition[COND_THIRST] > COND_HUNGRY)
	{
		act("$N is already too dehydrated to be affected.", ch, 0, victim, TO_CHAR);
		return;
	}

	act("You attempt to draw fluids from $N's body.", ch, 0, victim, TO_CHAR);
	act("A wave of nausea overcomes you as your gut clenches and sweat gushes from your pores.\n\rYou feel desperately thirsty.", ch, 0, victim, TO_VICT);
	act("$N doubles over in agony as rolls of sweat drip from $S body.", ch, 0, victim, TO_NOTVICT);

	if (is_npc(victim))
	{
		damage_new(ch, victim, dice(level, 3), sn, DAM_INTERNAL, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, nullptr);
	}
	else
	{
		damage_new(ch, victim, dice(COND_HUNGRY - victim->pcdata->condition[COND_THIRST], level / 5), sn, DAM_INTERNAL, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, nullptr);

		if (victim->pcdata->condition[COND_THIRST] >= 0)
			victim->pcdata->condition[COND_THIRST] = COND_HUNGRY;
	}
}